

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall camp::ForbiddenCall::ForbiddenCall(ForbiddenCall *this,string *functionName)

{
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *functionName_local;
  ForbiddenCall *this_local;
  
  local_18 = functionName;
  functionName_local = (string *)this;
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "the function ");
  std::operator+(local_38,(char *)local_58);
  Error::Error(&this->super_Error,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  *(undefined ***)&this->super_Error = &PTR__ForbiddenCall_001fd4d8;
  return;
}

Assistant:

ForbiddenCall::ForbiddenCall(const std::string& functionName)
    : Error("the function " + functionName + " is not callable")
{
}